

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O0

void __thiscall
NaLinearUnitsChain::NaLinearUnitsChain(NaLinearUnitsChain *this,NaLinearUnitsChain *rUnitsChain)

{
  int iVar1;
  NaLinearUnit *orig;
  long *in_RSI;
  NaDynAr<NaLinearUnit> *in_RDI;
  int i;
  undefined8 in_stack_ffffffffffffffc0;
  NaConfigPart *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd4;
  int local_20;
  
  NaDynAr<NaLinearUnit>::NaDynAr(in_RDI);
  NaUnit::NaUnit((NaUnit *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(uint)in_stack_ffffffffffffffc8,
                 (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  NaConfigPart::NaConfigPart
            ((NaConfigPart *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  in_RDI->_vptr_NaDynAr = (_func_int **)&PTR__NaLinearUnitsChain_00194428;
  in_RDI[1]._vptr_NaDynAr = (_func_int **)&PTR_PrintLog_00194510;
  in_RDI[2]._vptr_NaDynAr = (_func_int **)&PTR__NaLinearUnitsChain_00194580;
  local_20 = 0;
  while( true ) {
    iVar2 = local_20;
    iVar1 = (**(code **)(*in_RSI + 0x18))();
    if (iVar1 <= iVar2) break;
    orig = (NaLinearUnit *)operator_new(0x90);
    (**(code **)(*in_RSI + 0x88))(in_RSI,local_20);
    NaLinearUnit::NaLinearUnit((NaLinearUnit *)CONCAT44(iVar1,iVar2),orig);
    (*in_RDI->_vptr_NaDynAr[4])(in_RDI,orig);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

NaLinearUnitsChain::NaLinearUnitsChain (const NaLinearUnitsChain& rUnitsChain)
:   NaConfigPart(rUnitsChain)
{
    int i;
    for(i = 0; i < rUnitsChain.count(); ++i)
        addh(new NaLinearUnit(rUnitsChain.get(i)));
}